

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O1

HighsCDouble * __thiscall HighsCDouble::operator/=(HighsCDouble *this,HighsCDouble *v)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  HighsCDouble HVar8;
  HighsCDouble local_28;
  
  dVar4 = v->lo + v->hi;
  auVar2._8_8_ = dVar4;
  auVar2._0_8_ = dVar4;
  local_28 = (HighsCDouble)divpd((undefined1  [16])*this,auVar2);
  HVar8 = operator*(&local_28,v->hi);
  dVar5 = v->lo * local_28.hi;
  dVar6 = HVar8.hi + dVar5;
  dVar1 = this->hi;
  dVar7 = dVar6 - dVar1;
  dVar3 = local_28.hi - dVar7 / dVar4;
  this->hi = dVar3;
  this->lo = ((-(dVar7 / dVar4) - (dVar3 - local_28.hi)) +
              (local_28.hi - (dVar3 - (dVar3 - local_28.hi))) + local_28.lo) -
             (((-dVar1 - (dVar7 - dVar6)) + (dVar6 - (dVar7 - (dVar7 - dVar6))) +
              (HVar8.hi - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5))) + HVar8.lo) -
             this->lo) / dVar4;
  return this;
}

Assistant:

HighsCDouble& operator/=(const HighsCDouble& v) {
    double vdbl = v.hi + v.lo;
    HighsCDouble d(hi / vdbl, lo / vdbl);
    HighsCDouble c = d * v - (*this);
    c.hi /= vdbl;
    c.lo /= vdbl;
    *this = d - c;
    return *this;
  }